

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

bool IsCopyTypeInstr(Instr *instr)

{
  OpCode OVar1;
  Instr *instr_local;
  
  OVar1 = instr->m_opcode;
  if (((OVar1 == Ld_A) || (OVar1 == LdFld)) || (OVar1 == Ld_I4 || OVar1 == LdC_A_I4)) {
    instr_local._7_1_ = true;
  }
  else {
    instr_local._7_1_ = false;
  }
  return instr_local._7_1_;
}

Assistant:

static bool IsCopyTypeInstr(IR::Instr *instr)
{
    switch (instr->m_opcode)
    {
    case Js::OpCode::LdC_A_I4:
    case Js::OpCode::Ld_I4:
    case Js::OpCode::Ld_A:
    case Js::OpCode::LdFld: return true;
    default:
        return false;
    }
}